

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall
ON_CompressedBuffer::Uncompress(ON_CompressedBuffer *this,void *outbuffer,int *bFailedCRC)

{
  int iVar1;
  endian eVar2;
  ON__UINT32 OVar3;
  undefined1 local_4098 [4];
  ON__UINT32 uncompressed_crc;
  ON_CompressedBufferHelper helper;
  ON__UINT32 compressed_crc;
  bool rc;
  int *bFailedCRC_local;
  void *outbuffer_local;
  ON_CompressedBuffer *this_local;
  
  helper.m_buffer_compressed_capacity._7_1_ = 0;
  if (bFailedCRC != (int *)0x0) {
    *bFailedCRC = 0;
  }
  if (this->m_sizeof_uncompressed == 0) {
    this_local._7_1_ = true;
  }
  else if (outbuffer == (void *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this->m_method == 0) || (this->m_method == 1)) {
    helper.m_buffer_compressed_capacity._0_4_ =
         ON_CRC32(0,this->m_sizeof_compressed,this->m_buffer_compressed);
    if (((ON__UINT32)helper.m_buffer_compressed_capacity != this->m_crc_compressed) &&
       (memset(outbuffer,0,this->m_sizeof_uncompressed), bFailedCRC != (int *)0x0)) {
      *bFailedCRC = 0;
    }
    if (this->m_method == 0) {
      if ((this->m_buffer_compressed != (void *)0x0) &&
         (this->m_sizeof_uncompressed == this->m_sizeof_compressed)) {
        memcpy(outbuffer,this->m_buffer_compressed,this->m_sizeof_uncompressed);
        helper.m_buffer_compressed_capacity._7_1_ = 1;
      }
    }
    else if (this->m_method == 1) {
      memset(local_4098,0,0x4068);
      local_4098 = (undefined1  [4])0x2;
      helper.m_buffer_compressed_capacity._7_1_ =
           CompressionInit(this,(ON_CompressedBufferHelper *)local_4098);
      if ((bool)helper.m_buffer_compressed_capacity._7_1_) {
        helper.m_buffer_compressed_capacity._7_1_ =
             InflateHelper(this,(ON_CompressedBufferHelper *)local_4098,this->m_sizeof_uncompressed,
                           outbuffer);
        CompressionEnd(this,(ON_CompressedBufferHelper *)local_4098);
      }
    }
    iVar1 = this->m_sizeof_element;
    if ((((iVar1 == 2) || (iVar1 == 4)) || (iVar1 == 8)) &&
       ((this->m_sizeof_uncompressed % (ulong)(long)this->m_sizeof_element == 0 &&
        (eVar2 = ON::Endian(), eVar2 == big_endian)))) {
      ON_BinaryArchive::ToggleByteOrder
                ((long)(int)(this->m_sizeof_uncompressed / (ulong)(long)this->m_sizeof_element),
                 (long)this->m_sizeof_element,outbuffer,outbuffer);
    }
    if ((((helper.m_buffer_compressed_capacity._7_1_ & 1) != 0) &&
        (OVar3 = ON_CRC32(0,this->m_sizeof_uncompressed,outbuffer),
        OVar3 != this->m_crc_uncompressed)) &&
       (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_zlib.cpp"
                   ,0x420,"","ON_CompressedBuffer::Uncompress() crc error"),
       bFailedCRC != (int *)0x0)) {
      *bFailedCRC = 1;
    }
    this_local._7_1_ = (bool)(helper.m_buffer_compressed_capacity._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CompressedBuffer::Uncompress(
          void* outbuffer,
          int* bFailedCRC
          ) const
{
  bool rc = false;

  if ( bFailedCRC)
    *bFailedCRC = false;
  if ( 0 == m_sizeof_uncompressed )
    return true;
  if ( 0 == outbuffer )
    return false;

  if ( m_method != 0 && m_method != 1 )
    return false;

  ON__UINT32 compressed_crc = ON_CRC32( 0, m_sizeof_compressed, m_buffer_compressed );
  if ( compressed_crc != m_crc_compressed )
  {
    // m_buffer_compressed is corrupt - let's hope the corruption
    // is near the end and we ge something useful from the
    // beginning.
    memset(outbuffer,0,m_sizeof_uncompressed);
    if ( bFailedCRC)
      *bFailedCRC = false;
  }

  switch(m_method)
  {
  case 0: // uncompressed
    if (    m_buffer_compressed
         && m_sizeof_uncompressed == m_sizeof_compressed
         )
    {
      memcpy(outbuffer,m_buffer_compressed,m_sizeof_uncompressed);
      rc = true;
    }
    break;

  case 1: // compressed
    {
      ON_CompressedBufferHelper helper;
      memset(&helper,0,sizeof(helper));
      helper.m_action = 2;
      rc = CompressionInit(&helper);
      if (rc)
      {
        rc = InflateHelper( &helper, m_sizeof_uncompressed, outbuffer );
        CompressionEnd(&helper);
      }
    }
    break;
  }

  switch(m_sizeof_element)
  {
  case 2:
  case 4:
  case 8:
    if ( 0 == (m_sizeof_uncompressed%m_sizeof_element) )
    {
      if (ON::endian::big_endian == ON::Endian())
      {
        ON_BinaryFile::ToggleByteOrder( 
          (int)(m_sizeof_uncompressed/m_sizeof_element), 
          m_sizeof_element, 
          outbuffer, 
          outbuffer
          );
      }
    }
    break;
  };


  if (rc ) 
  {
    ON__UINT32 uncompressed_crc = ON_CRC32( 0, m_sizeof_uncompressed, outbuffer );
    if ( uncompressed_crc != m_crc_uncompressed ) 
    {
      ON_ERROR("ON_CompressedBuffer::Uncompress() crc error");
      if ( bFailedCRC )
        *bFailedCRC = true;
    }
  }

  return rc;
}